

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O3

void __thiscall soplex::SPxBasisBase<double>::addedCols(SPxBasisBase<double> *this,int n)

{
  SPxId *pSVar1;
  int iVar2;
  Status SVar3;
  uint uVar4;
  undefined8 *puVar5;
  SPxStatus SVar6;
  SPxSolverBase<double> *theLP;
  long lVar7;
  DataKey local_50;
  long local_48;
  undefined1 local_40 [16];
  DataKey local_30;
  
  if (0 < n) {
    reDim(this);
    theLP = this->theLP;
    iVar2 = (theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
            thenum - n;
    if (theLP->theRep == ROW) {
      lVar7 = (long)iVar2;
      do {
        SVar3 = primalColStatus<double>((int)lVar7,&theLP->super_SPxLPBase<double>);
        (this->thedesc).colstat.data[lVar7] = SVar3;
        local_30 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thekey[lVar7];
        SPxColId::SPxColId((SPxColId *)&local_50,&local_30);
        pSVar1 = (this->theBaseId).data;
        pSVar1[lVar7].super_DataKey = local_50;
        pSVar1[lVar7].super_DataKey.info = 1;
        lVar7 = lVar7 + 1;
        theLP = this->theLP;
      } while (lVar7 < (theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum);
    }
    else {
      lVar7 = (long)iVar2;
      do {
        SVar3 = primalColStatus<double>((int)lVar7,&theLP->super_SPxLPBase<double>);
        (this->thedesc).colstat.data[lVar7] = SVar3;
        lVar7 = lVar7 + 1;
        theLP = this->theLP;
      } while (lVar7 < (theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum);
    }
    SVar6 = this->thestatus;
    if ((NO_PROBLEM < SVar6) && (this->matrixIsSetup == true)) {
      loadMatrixVecs(this);
      SVar6 = this->thestatus;
    }
    uVar4 = SVar6 + PRIMAL;
    if (7 < uVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ECHBAS08 Unknown basis status!",0x1e);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_50 = (DataKey)local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"XCHBAS02 This should never happen.","");
      *puVar5 = &PTR__SPxException_0069d438;
      puVar5[1] = puVar5 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar5 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
      *puVar5 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    if ((0x17U >> (uVar4 & 0x1f) & 1) == 0) {
      SVar6 = REGULAR;
      if ((0x60U >> (uVar4 & 0x1f) & 1) != 0) {
        SVar6 = PRIMAL;
      }
      this->thestatus = SVar6;
    }
  }
  return;
}

Assistant:

void SPxBasisBase<R>::addedCols(int n)
{
   assert(theLP != nullptr);

   if(n > 0)
   {
      reDim();

      if(theLP->rep() == SPxSolverBase<R>::ROW)
      {
         /* after adding columns in row representation, reDim() should set these bools to false. */
         assert(!matrixIsSetup && !factorized);

         for(int i = theLP->nCols() - n; i < theLP->nCols(); ++i)
         {
            thedesc.colStatus(i) = primalColStatus(i, theLP);
            baseId(i) = theLP->SPxLPBase<R>::cId(i);
         }
      }
      else
      {
         assert(theLP->rep() == SPxSolverBase<R>::COLUMN);

         for(int i = theLP->nCols() - n; i < theLP->nCols(); ++i)
            thedesc.colStatus(i) = primalColStatus(i, theLP);
      }

      /* If matrix was set up, load new basis vectors to the matrix
       * In the column case, the basis is not effected by adding columns. However,
       * since @c matrix stores references to the columns in the LP (SPxLPBase<R>), a realloc
       * in SPxLPBase<R> (e.g. due to space requirements) might invalidate these references.
       * We therefore have to "reload" the matrix if it is set up. Note that reDim()
       * leaves @c matrixIsSetup untouched if only columns have been added, since the
       * basis matrix already has the correct size. */
      if(status() > NO_PROBLEM && matrixIsSetup)
         loadMatrixVecs();

      switch(status())
      {
      case DUAL:
      case INFEASIBLE:
         setStatus(REGULAR);
         break;

      case OPTIMAL:
      case UNBOUNDED:
         setStatus(PRIMAL);
         break;

      case NO_PROBLEM:
      case SINGULAR:
      case REGULAR:
      case PRIMAL:
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ECHBAS08 Unknown basis status!" << std::endl;)
         throw SPxInternalCodeException("XCHBAS02 This should never happen.");
      }
   }
}